

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O2

void duckdb::
     TemplatedWritePlain<duckdb::string_t,duckdb::string_t,duckdb::ParquetStringOperator,true>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  long lVar1;
  undefined8 *puVar2;
  idx_t r;
  string_t target_value_00;
  string_t target_value;
  anon_union_16_2_67f50693_for_value local_40;
  
  lVar1 = chunk_start * 0x10;
  puVar2 = (undefined8 *)(lVar1 + *(long *)(col + 0x20) + 8);
  for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
    local_40._0_8_ = puVar2[-1];
    local_40.pointer.ptr = (char *)*puVar2;
    target_value_00.value.pointer.ptr = (char *)lVar1;
    target_value_00.value._0_8_ = local_40.pointer.ptr;
    ParquetBaseStringOperator::HandleStats<duckdb::string_t,duckdb::string_t>
              ((ParquetBaseStringOperator *)stats,(ColumnWriterStatistics *)local_40._0_8_,
               target_value_00);
    ParquetBaseStringOperator::WriteToStream<duckdb::string_t,duckdb::string_t>
              ((string_t *)&local_40.pointer,(WriteStream *)mask);
    puVar2 = puVar2 + 2;
  }
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}